

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jmemmgr.c
# Opt level: O0

void realize_virt_arrays(j_common_ptr cinfo)

{
  undefined1 *puVar1;
  JSAMPARRAY ppJVar2;
  JBLOCKARRAY ppaJVar3;
  j_common_ptr in_RDI;
  size_t new_space_1;
  size_t new_space;
  jvirt_barray_ptr bptr;
  jvirt_sarray_ptr sptr;
  size_t max_minheights;
  size_t minheights;
  size_t avail_mem;
  size_t maximum_space;
  size_t space_per_minheight;
  my_mem_ptr mem;
  backing_store_ptr in_stack_ffffffffffffffa8;
  j_common_ptr in_stack_ffffffffffffffb0;
  _func_jvirt_barray_ptr_j_common_ptr_int_boolean_JDIMENSION_JDIMENSION_JDIMENSION *local_48;
  _func_jvirt_sarray_ptr_j_common_ptr_int_boolean_JDIMENSION_JDIMENSION_JDIMENSION *local_40;
  ulong local_38;
  char *max_bytes_needed;
  size_t min_bytes_needed;
  jpeg_memory_mgr *cinfo_00;
  
  cinfo_00 = in_RDI->mem;
  min_bytes_needed = 0;
  max_bytes_needed = (char *)0x0;
  for (local_40 = cinfo_00[1].request_virt_sarray;
      local_40 !=
      (_func_jvirt_sarray_ptr_j_common_ptr_int_boolean_JDIMENSION_JDIMENSION_JDIMENSION *)0x0;
      local_40 = *(_func_jvirt_sarray_ptr_j_common_ptr_int_boolean_JDIMENSION_JDIMENSION_JDIMENSION
                   **)(local_40 + 0x30)) {
    if (*(long *)local_40 == 0) {
      in_stack_ffffffffffffffb0 =
           (j_common_ptr)((ulong)*(uint *)(local_40 + 8) * (ulong)*(uint *)(local_40 + 0xc));
      min_bytes_needed =
           (ulong)*(uint *)(local_40 + 0x10) * (ulong)*(uint *)(local_40 + 0xc) + min_bytes_needed;
      if ((j_common_ptr)(-1 - (long)max_bytes_needed) < in_stack_ffffffffffffffb0) {
        out_of_memory(in_stack_ffffffffffffffb0,(int)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
      }
      max_bytes_needed = (char *)((long)&in_stack_ffffffffffffffb0->err + (long)max_bytes_needed);
    }
  }
  for (local_48 = cinfo_00[1].request_virt_barray;
      local_48 !=
      (_func_jvirt_barray_ptr_j_common_ptr_int_boolean_JDIMENSION_JDIMENSION_JDIMENSION *)0x0;
      local_48 = *(_func_jvirt_barray_ptr_j_common_ptr_int_boolean_JDIMENSION_JDIMENSION_JDIMENSION
                   **)(local_48 + 0x30)) {
    if (*(long *)local_48 == 0) {
      in_stack_ffffffffffffffa8 =
           (backing_store_ptr)
           ((ulong)*(uint *)(local_48 + 8) * (ulong)*(uint *)(local_48 + 0xc) * 0x80);
      min_bytes_needed =
           (ulong)*(uint *)(local_48 + 0x10) * (ulong)*(uint *)(local_48 + 0xc) * 0x80 +
           min_bytes_needed;
      if ((backing_store_ptr)(-(long)max_bytes_needed - 1U) < in_stack_ffffffffffffffa8) {
        out_of_memory(in_stack_ffffffffffffffb0,(int)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
      }
      max_bytes_needed = in_stack_ffffffffffffffa8->temp_name + (long)(max_bytes_needed + -0x20);
    }
  }
  if (min_bytes_needed != 0) {
    puVar1 = (undefined1 *)
             jpeg_mem_available(in_RDI,min_bytes_needed,(size_t)max_bytes_needed,
                                (size_t)cinfo_00[1].realize_virt_arrays);
    if (puVar1 < max_bytes_needed) {
      local_38 = (ulong)puVar1 / min_bytes_needed;
      if (local_38 == 0) {
        local_38 = 1;
      }
    }
    else {
      local_38 = 1000000000;
    }
    for (local_40 = cinfo_00[1].request_virt_sarray;
        local_40 !=
        (_func_jvirt_sarray_ptr_j_common_ptr_int_boolean_JDIMENSION_JDIMENSION_JDIMENSION *)0x0;
        local_40 = *(_func_jvirt_sarray_ptr_j_common_ptr_int_boolean_JDIMENSION_JDIMENSION_JDIMENSION
                     **)(local_40 + 0x30)) {
      if (*(long *)local_40 == 0) {
        if (local_38 <
            (long)((ulong)*(uint *)(local_40 + 8) - 1) / (long)(ulong)*(uint *)(local_40 + 0x10) +
            1U) {
          *(int *)(local_40 + 0x14) = (int)local_38 * *(int *)(local_40 + 0x10);
          jpeg_open_backing_store(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,0x1739b3);
          *(undefined4 *)(local_40 + 0x2c) = 1;
        }
        else {
          *(undefined4 *)(local_40 + 0x14) = *(undefined4 *)(local_40 + 8);
        }
        ppJVar2 = alloc_sarray((j_common_ptr)cinfo_00,(int)(min_bytes_needed >> 0x20),
                               (JDIMENSION)min_bytes_needed,
                               (JDIMENSION)((ulong)max_bytes_needed >> 0x20));
        *(JSAMPARRAY *)local_40 = ppJVar2;
        *(undefined4 *)(local_40 + 0x18) = *(undefined4 *)&cinfo_00[1].access_virt_sarray;
        *(undefined4 *)(local_40 + 0x1c) = 0;
        *(undefined4 *)(local_40 + 0x20) = 0;
        *(undefined4 *)(local_40 + 0x28) = 0;
      }
    }
    for (local_48 = cinfo_00[1].request_virt_barray;
        local_48 !=
        (_func_jvirt_barray_ptr_j_common_ptr_int_boolean_JDIMENSION_JDIMENSION_JDIMENSION *)0x0;
        local_48 = *(_func_jvirt_barray_ptr_j_common_ptr_int_boolean_JDIMENSION_JDIMENSION_JDIMENSION
                     **)(local_48 + 0x30)) {
      if (*(long *)local_48 == 0) {
        if (local_38 <
            (long)((ulong)*(uint *)(local_48 + 8) - 1) / (long)(ulong)*(uint *)(local_48 + 0x10) +
            1U) {
          *(int *)(local_48 + 0x14) = (int)local_38 * *(int *)(local_48 + 0x10);
          jpeg_open_backing_store(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,0x173ae9);
          *(undefined4 *)(local_48 + 0x2c) = 1;
        }
        else {
          *(undefined4 *)(local_48 + 0x14) = *(undefined4 *)(local_48 + 8);
        }
        ppaJVar3 = alloc_barray((j_common_ptr)cinfo_00,(int)(min_bytes_needed >> 0x20),
                                (JDIMENSION)min_bytes_needed,
                                (JDIMENSION)((ulong)max_bytes_needed >> 0x20));
        *(JBLOCKARRAY *)local_48 = ppaJVar3;
        *(undefined4 *)(local_48 + 0x18) = *(undefined4 *)&cinfo_00[1].access_virt_sarray;
        *(undefined4 *)(local_48 + 0x1c) = 0;
        *(undefined4 *)(local_48 + 0x20) = 0;
        *(undefined4 *)(local_48 + 0x28) = 0;
      }
    }
  }
  return;
}

Assistant:

METHODDEF(void)
realize_virt_arrays(j_common_ptr cinfo)
/* Allocate the in-memory buffers for any unrealized virtual arrays */
{
  my_mem_ptr mem = (my_mem_ptr)cinfo->mem;
  size_t space_per_minheight, maximum_space, avail_mem;
  size_t minheights, max_minheights;
  jvirt_sarray_ptr sptr;
  jvirt_barray_ptr bptr;

  /* Compute the minimum space needed (maxaccess rows in each buffer)
   * and the maximum space needed (full image height in each buffer).
   * These may be of use to the system-dependent jpeg_mem_available routine.
   */
  space_per_minheight = 0;
  maximum_space = 0;
  for (sptr = mem->virt_sarray_list; sptr != NULL; sptr = sptr->next) {
    if (sptr->mem_buffer == NULL) { /* if not realized yet */
      size_t new_space = (long)sptr->rows_in_array *
                         (long)sptr->samplesperrow * sizeof(JSAMPLE);

      space_per_minheight += (long)sptr->maxaccess *
                             (long)sptr->samplesperrow * sizeof(JSAMPLE);
      if (SIZE_MAX - maximum_space < new_space)
        out_of_memory(cinfo, 10);
      maximum_space += new_space;
    }
  }
  for (bptr = mem->virt_barray_list; bptr != NULL; bptr = bptr->next) {
    if (bptr->mem_buffer == NULL) { /* if not realized yet */
      size_t new_space = (long)bptr->rows_in_array *
                         (long)bptr->blocksperrow * sizeof(JBLOCK);

      space_per_minheight += (long)bptr->maxaccess *
                             (long)bptr->blocksperrow * sizeof(JBLOCK);
      if (SIZE_MAX - maximum_space < new_space)
        out_of_memory(cinfo, 11);
      maximum_space += new_space;
    }
  }

  if (space_per_minheight <= 0)
    return;                     /* no unrealized arrays, no work */

  /* Determine amount of memory to actually use; this is system-dependent. */
  avail_mem = jpeg_mem_available(cinfo, space_per_minheight, maximum_space,
                                 mem->total_space_allocated);

  /* If the maximum space needed is available, make all the buffers full
   * height; otherwise parcel it out with the same number of minheights
   * in each buffer.
   */
  if (avail_mem >= maximum_space)
    max_minheights = 1000000000L;
  else {
    max_minheights = avail_mem / space_per_minheight;
    /* If there doesn't seem to be enough space, try to get the minimum
     * anyway.  This allows a "stub" implementation of jpeg_mem_available().
     */
    if (max_minheights <= 0)
      max_minheights = 1;
  }

  /* Allocate the in-memory buffers and initialize backing store as needed. */

  for (sptr = mem->virt_sarray_list; sptr != NULL; sptr = sptr->next) {
    if (sptr->mem_buffer == NULL) { /* if not realized yet */
      minheights = ((long)sptr->rows_in_array - 1L) / sptr->maxaccess + 1L;
      if (minheights <= max_minheights) {
        /* This buffer fits in memory */
        sptr->rows_in_mem = sptr->rows_in_array;
      } else {
        /* It doesn't fit in memory, create backing store. */
        sptr->rows_in_mem = (JDIMENSION)(max_minheights * sptr->maxaccess);
        jpeg_open_backing_store(cinfo, &sptr->b_s_info,
                                (long)sptr->rows_in_array *
                                (long)sptr->samplesperrow *
                                (long)sizeof(JSAMPLE));
        sptr->b_s_open = TRUE;
      }
      sptr->mem_buffer = alloc_sarray(cinfo, JPOOL_IMAGE,
                                      sptr->samplesperrow, sptr->rows_in_mem);
      sptr->rowsperchunk = mem->last_rowsperchunk;
      sptr->cur_start_row = 0;
      sptr->first_undef_row = 0;
      sptr->dirty = FALSE;
    }
  }

  for (bptr = mem->virt_barray_list; bptr != NULL; bptr = bptr->next) {
    if (bptr->mem_buffer == NULL) { /* if not realized yet */
      minheights = ((long)bptr->rows_in_array - 1L) / bptr->maxaccess + 1L;
      if (minheights <= max_minheights) {
        /* This buffer fits in memory */
        bptr->rows_in_mem = bptr->rows_in_array;
      } else {
        /* It doesn't fit in memory, create backing store. */
        bptr->rows_in_mem = (JDIMENSION)(max_minheights * bptr->maxaccess);
        jpeg_open_backing_store(cinfo, &bptr->b_s_info,
                                (long)bptr->rows_in_array *
                                (long)bptr->blocksperrow *
                                (long)sizeof(JBLOCK));
        bptr->b_s_open = TRUE;
      }
      bptr->mem_buffer = alloc_barray(cinfo, JPOOL_IMAGE,
                                      bptr->blocksperrow, bptr->rows_in_mem);
      bptr->rowsperchunk = mem->last_rowsperchunk;
      bptr->cur_start_row = 0;
      bptr->first_undef_row = 0;
      bptr->dirty = FALSE;
    }
  }
}